

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Cnf_Dat_t * Jf_ManCreateCnfRemap(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas,int fAddOrCla)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  bool bVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  if (fAddOrCla != 0) {
    Vec_IntPush(vClas,vLits->nSize);
    pVVar5 = p->vCos;
    uVar9 = (ulong)(uint)pVVar5->nSize;
    if (p->nRegs < pVVar5->nSize) {
      lVar11 = 0;
      do {
        if ((int)uVar9 <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar12 = pVVar5->pArray[lVar11];
        if ((iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_006fe200;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Vec_IntPush(vLits,iVar12 * 2);
        lVar11 = lVar11 + 1;
        pVVar5 = p->vCos;
        uVar9 = (ulong)pVVar5->nSize;
      } while (lVar11 < (long)(uVar9 - (long)p->nRegs));
    }
  }
  if (0 < vLits->nSize) {
    lVar11 = 0;
    do {
      if (vLits->pArray[lVar11] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar8 = (uint)vLits->pArray[lVar11] >> 1;
      if (p->nObjs <= (int)uVar8) goto LAB_006fe200;
      *(ulong *)(p->pObjs + uVar8) = *(ulong *)(p->pObjs + uVar8) | 0x40000000;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vLits->nSize);
  }
  lVar11 = (long)p->nObjs;
  __s = (int *)malloc(lVar11 * 4);
  memset(__s,0xff,lVar11 * 4);
  if (lVar11 < 1) {
    iVar12 = 0;
  }
  else {
    iVar12 = 0;
    lVar4 = lVar11 * 3;
    do {
      if (p->nObjs < lVar11) {
LAB_006fe200:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)(&pGVar1[-1].field_0x0 + lVar4 * 4) >> 0x1e & 1) != 0) {
        *(ulong *)(&pGVar1[-1].field_0x0 + lVar4 * 4) =
             *(ulong *)(&pGVar1[-1].field_0x0 + lVar4 * 4) & 0xffffffffbfffffff;
        __s[lVar11 + -1] = iVar12;
        iVar12 = iVar12 + 1;
      }
      bVar3 = 1 < lVar11;
      lVar11 = lVar11 + -1;
      lVar4 = lVar4 + -3;
    } while (bVar3);
  }
  iVar10 = vLits->nSize;
  if (0 < iVar10) {
    piVar2 = vLits->pArray;
    lVar11 = 0;
    do {
      uVar8 = piVar2[lVar11];
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf7,"int Abc_Lit2LitV(int *, int)");
      }
      if (__s[uVar8 >> 1] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      piVar2[lVar11] = (uVar8 & 1) + __s[uVar8 >> 1] * 2;
      lVar11 = lVar11 + 1;
      iVar10 = vLits->nSize;
    } while (lVar11 < iVar10);
  }
  pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar6->pMan = (Aig_Man_t *)p;
  pCVar6->nVars = iVar12;
  pCVar6->nLiterals = iVar10;
  iVar12 = vClas->nSize;
  pCVar6->nClauses = iVar12;
  ppiVar7 = (int **)malloc((long)iVar12 * 8 + 8);
  pCVar6->pClauses = ppiVar7;
  piVar2 = vLits->pArray;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar7 = piVar2;
  iVar12 = vClas->nSize;
  if ((long)iVar12 < 1) {
    lVar11 = 0;
  }
  else {
    piVar2 = vClas->pArray;
    lVar11 = 0;
    do {
      ppiVar7[lVar11] = *ppiVar7 + piVar2[lVar11];
      lVar11 = lVar11 + 1;
    } while (iVar12 != lVar11);
  }
  ppiVar7[lVar11] = *ppiVar7 + iVar10;
  pCVar6->pVarNums = __s;
  return pCVar6;
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnfRemap( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int i, Entry, * pMap, nVars = 0;
    if ( fAddOrCla )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vLits, Abc_Var2Lit(Gia_ObjId(p, pObj), 0) );
    }
    // label nodes present in the mapping
    Vec_IntForEachEntry( vLits, Entry, i )
        Gia_ManObj(p, Abc_Lit2Var(Entry))->fMark0 = 1;
    // create variable map
    pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjReverse( p, pObj, i )
        if ( pObj->fMark0 )
            pObj->fMark0 = 0, pMap[i] = nVars++;
    // relabel literals
    Vec_IntForEachEntry( vLits, Entry, i )
        Vec_IntWriteEntry( vLits, i, Abc_Lit2LitV(pMap, Entry) );
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums = pMap;
    return pCnf;
}